

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O3

void Cba_NtkPrintStatsFull(Cba_Ntk_t *p,int fDistrib,int fVerbose)

{
  Cba_Man_t *pCVar1;
  char *pcVar2;
  int fVerbose_00;
  long lVar3;
  char *pTypeNames [90];
  char *pcStack_2f8;
  undefined8 local_2f0 [89];
  
  Cba_ManCreatePrimMap(&pcStack_2f8);
  pcVar2 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  printf("%-20s : ",pcVar2);
  printf("PI = %4d  ",(ulong)(uint)(p->vInputs).nSize);
  printf("PO = %4d  ",(ulong)(uint)(p->vOutputs).nSize);
  printf("FF = %4d  ",(ulong)(uint)(p->vSeq).nSize);
  fVerbose_00 = (p->vObjType).nSize + -1;
  printf("Obj = %6d  ");
  printf("Mem = %.3f MB",
         SUB84((double)((int)((double)(p->vArray1).nCap * 4.0 + 16.0) * 2 +
                        (int)((double)(p->vFonBits).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFonObj).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFonRange).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vSeq).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vObjAttr).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vObjFon0).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFonCopy).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vOutputs).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vObjFunc).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFinFon).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFonName).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vOrder).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vObjName).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vObjFin0).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vAttrSto).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vInputs).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vObjCopy).nCap * 4.0 + 16.0) + 0x1c0 +
                        (int)((double)(p->vFinObj).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFonNext).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFinFon0).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vFonPrev).nCap * 4.0 + 16.0) +
                        (int)((double)(p->vNtkObjs).nCap * 4.0 + 16.0) + (p->vObjType).nCap) *
               9.5367431640625e-07,0));
  putchar(10);
  if (fDistrib == 0) {
    if (fVerbose != 0) {
      puts("Node type statistics:");
      lVar3 = 0;
      do {
        pCVar1 = p->pDesign;
        if (pCVar1->nObjs[lVar3 + 1] != 0) {
          if ((pCVar1->nAnds[0] == 0) || (pCVar1->nAnds[lVar3 + 1] == 0)) {
            printf("%2d  :  %-8s  %6d\n",(ulong)((int)lVar3 + 1),local_2f0[lVar3]);
          }
          else {
            printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                   SUB84(((double)pCVar1->nAnds[lVar3 + 1] * 100.0) / (double)pCVar1->nAnds[0],0),
                   (ulong)((int)lVar3 + 1),local_2f0[lVar3]);
          }
        }
        lVar3 = lVar3 + 1;
      } while (lVar3 != 0x59);
    }
  }
  else {
    Cba_NtkPrintDistrib(p,fVerbose_00);
  }
  return;
}

Assistant:

void Cba_NtkPrintStatsFull( Cba_Ntk_t * p, int fDistrib, int fVerbose )
{
    int i;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "%-20s : ",        Cba_NtkName(p) );
    printf( "PI = %4d  ",      Cba_NtkPiNum(p) );
    printf( "PO = %4d  ",      Cba_NtkPoNum(p) );
    printf( "FF = %4d  ",      Cba_NtkBoxSeqNum(p) );
    printf( "Obj = %6d  ",     Cba_NtkObjNum(p) );
    printf( "Mem = %.3f MB",   1.0*Cba_NtkMemory(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Cba_NtkPrintDistrib( p, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < CBA_BOX_LAST; i++ )
    {
        if ( !p->pDesign->nObjs[i] )
            continue;
        if ( p->pDesign->nAnds[0] && p->pDesign->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, pTypeNames[i], p->pDesign->nObjs[i], 100.0*p->pDesign->nAnds[i]/p->pDesign->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, pTypeNames[i], p->pDesign->nObjs[i] );
    }
}